

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionCompiler.cpp
# Opt level: O2

bool __thiscall OpenMD::SelectionCompiler::clauseWithin(SelectionCompiler *this)

{
  int iVar1;
  bool bVar2;
  any distance;
  Token tokenDistance;
  Token local_70;
  any local_58;
  Token local_48;
  Token local_30;
  
  tokenNext(&local_30,this);
  std::any::reset(&local_30.value);
  tokenNext(&local_48,this);
  iVar1 = local_48.tok;
  std::any::reset(&local_48.value);
  if (iVar1 == 0x400) {
    local_58._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
    local_58._M_storage._M_ptr = (void *)0x0;
    tokenNext(&local_48,this);
    if ((local_48.tok & 0xfffffffeU) == 2) {
      std::any::operator=(&local_58,&local_48.value);
      tokenNext(&local_70,this);
      iVar1 = local_70.tok;
      std::any::reset(&local_70.value);
      if (iVar1 == 0x404) {
        bVar2 = clauseOr(this);
        if (bVar2) {
          tokenNext(&local_70,this);
          std::any::reset(&local_70.value);
          if (local_70.tok == 0x401) {
            Token::Token(&local_70,0x1406,&local_58);
            std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>::push_back
                      (&this->ltokenPostfix,&local_70);
            std::any::reset(&local_70.value);
            bVar2 = true;
          }
          else {
            bVar2 = rightParenthesisExpected(this);
          }
        }
        else {
          bVar2 = false;
        }
      }
      else {
        bVar2 = commaExpected(this);
      }
    }
    else {
      bVar2 = numberOrKeywordExpected(this);
    }
    std::any::reset(&local_48.value);
    std::any::reset(&local_58);
  }
  else {
    bVar2 = leftParenthesisExpected(this);
  }
  return bVar2;
}

Assistant:

bool SelectionCompiler::clauseWithin() {
    tokenNext();                                // WITHIN
    if (tokenNext().tok != Token::leftparen) {  // (
      return leftParenthesisExpected();
    }

    std::any distance;
    Token tokenDistance = tokenNext();  // distance
    switch (tokenDistance.tok) {
    case Token::integer:
    case Token::decimal:
      distance = tokenDistance.value;
      break;
    default:
      return numberOrKeywordExpected();
    }

    if (tokenNext().tok != Token::opOr) {  // ,
      return commaExpected();
    }

    if (!clauseOr()) {  // *expression*
      return false;
    }

    if (tokenNext().tok != Token::rightparen) {  // )T
      return rightParenthesisExpected();
    }

    return addTokenToPostfix(Token(Token::within, distance));
  }